

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_view.cpp
# Opt level: O1

void ViewTrack_MFM_FM(Encoding encoding,BitBuffer *bitbuf)

{
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  undefined7 extraout_var;
  undefined7 uVar9;
  undefined8 uVar7;
  undefined4 extraout_var_00;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  LogHelper *pLVar8;
  int i;
  uint uVar10;
  char cVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  size_type __n;
  bool bVar15;
  vector<colour,_std::allocator<colour>_> colours;
  Data track_data;
  colour local_89;
  ulong local_88;
  int local_80;
  uint local_7c;
  vector<colour,_std::allocator<colour>_> local_78;
  Encoding local_5c;
  undefined8 local_58;
  undefined8 local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_5c = encoding;
  iVar5 = BitBuffer::track_bitsize(bitbuf);
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (colour *)0x0;
  local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data.
  _M_start = (colour *)0x0;
  local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data.
  _M_finish = (colour *)0x0;
  __n = (size_type)((iVar5 * 0x6e) / 100);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&local_48,__n);
  std::vector<colour,_std::allocator<colour>_>::reserve(&local_78,__n);
  iVar5 = opt.a1sync;
  local_58 = 0;
  BitBuffer::seek(bitbuf,0);
  local_88 = 0xffff;
  local_50 = 0;
  local_80 = 0;
  uVar13 = 0;
LAB_00151a72:
  do {
    iVar6 = 1;
    do {
      bVar2 = BitBuffer::wrapped(bitbuf);
      if (bVar2) {
        iVar5 = 0;
        if (0 < opt.bytes_begin) {
          iVar5 = opt.bytes_begin;
        }
        iVar14 = (int)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                 (int)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        iVar6 = iVar14;
        if (opt.bytes_end < iVar14) {
          iVar6 = opt.bytes_end;
        }
        if (opt.bytes_end < 0) {
          iVar6 = iVar14;
        }
        if (iVar5 < iVar6) {
          pLVar8 = util::operator<<((LogHelper *)&util::cout,&local_5c);
          pLVar8 = util::operator<<(pLVar8,(char (*) [10])" Decode (");
          local_7c = BitBuffer::track_bitsize(bitbuf);
          pLVar8 = util::operator<<(pLVar8,(int *)&local_7c);
          util::operator<<(pLVar8,(char (*) [9])" bits):\n");
          util::
          hex_dump<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start + iVar6),iVar5,
                     local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                     super__Vector_impl_data._M_start,0x10);
        }
        if (local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
            super__Vector_impl_data._M_start != (colour *)0x0) {
          operator_delete(local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        return;
      }
      bVar3 = BitBuffer::read1(bitbuf);
      uVar13 = (uint)bVar3 | uVar13 * 2;
      if ((local_5c != MFM) ||
         (bVar2 = true, (uVar13 & ((uint)(iVar5 == 0) << 5 | 0xffdf)) != 0x4489)) {
        bVar15 = false;
        bVar2 = false;
        if (local_5c == FM) {
          bVar2 = bVar15;
          if ((int)uVar13 < -0x55ddd576) {
            if ((uVar13 + 0x55ddd778 < 0x23) &&
               ((0x500000005U >> ((ulong)(uVar13 + 0x55ddd778) & 0x3f) & 1) != 0)) {
LAB_00151add:
              bVar2 = true;
            }
          }
          else if (((uVar13 == 0xaa222a8a) || (uVar13 == 0xaa2a2a88)) || (uVar13 == 0xaa222aa8))
          goto LAB_00151add;
        }
      }
      iVar14 = iVar6 + 1;
    } while ((!bVar2) &&
            (bVar15 = iVar6 != (uint)(local_5c != MFM) * 0x10 + 0x10, iVar6 = iVar14, bVar15));
    bVar3 = 7;
    if (local_5c == MFM) {
      uVar12 = 0xe;
      bVar4 = 0;
      do {
        bVar4 = bVar4 | ((uVar13 >> (uVar12 & 0x1f) & 1) != 0) << (bVar3 & 0x1f);
        bVar3 = bVar3 - 1;
        uVar12 = uVar12 - 2;
      } while (uVar12 != 0xfffffffe);
    }
    else {
      uVar12 = 0x1d;
      bVar4 = 0;
      do {
        bVar4 = bVar4 | ((uVar13 >> (uVar12 & 0x1f) & 1) != 0) << (bVar3 & 0x1f);
        bVar3 = bVar3 - 1;
        uVar12 = uVar12 - 4;
      } while (uVar12 != 0xfffffffd);
    }
    uVar12 = (uint)local_88;
    uVar9 = 0;
    local_7c = CONCAT31((int3)(local_7c >> 8),bVar4);
    if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_48,
                 (iterator)
                 local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uchar *)&local_7c);
      uVar9 = extraout_var;
    }
    else {
      *local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish = bVar4;
      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    uVar10 = uVar12 + 1;
    if ((bool)(local_5c != MFM | bVar2 ^ 1U)) {
      uVar7 = CONCAT71(uVar9,(char)local_50 == -2);
      local_88 = CONCAT44(local_88._4_4_,uVar10);
      if (uVar10 == 4 && (char)local_50 == -2) {
        iVar6 = Sector::SizeCodeToLength(local_7c & 0xff);
        uVar7 = CONCAT44(extraout_var_00,iVar6);
        local_58 = uVar7;
      }
      uVar1 = local_88;
      if (local_80 == 3) {
        local_89 = RED;
        if (local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<colour,_std::allocator<colour>_>::_M_realloc_insert<colour>
                    (&local_78,
                     (iterator)
                     local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_89);
          uVar7 = extraout_RAX;
        }
        else {
          *local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
           super__Vector_impl_data._M_finish = RED;
LAB_00151c65:
          local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      else {
        if ((bool)(bVar2 ^ 1U) || local_5c != FM) {
          cVar11 = (char)local_50;
          if (uVar12 < 4 && cVar11 == -2) {
            local_89 = ((int)local_88 != 3) * -0x80 + GREEN;
            if (local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<colour,_std::allocator<colour>_>::_M_realloc_insert<colour>
                        (&local_78,
                         (iterator)
                         local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_89);
            }
            else {
              *local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
               super__Vector_impl_data._M_finish = local_89;
              local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            local_88 = uVar1 & 0xffffffff;
          }
          else if (((cVar11 == -5) && (-1 < (int)uVar12)) && ((int)uVar12 < (int)local_58)) {
            local_89 = none;
            if (local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
               super__Vector_impl_data._M_finish = none;
              goto LAB_00151de3;
            }
            std::vector<colour,_std::allocator<colour>_>::_M_realloc_insert<colour>
                      (&local_78,
                       (iterator)
                       local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_89);
            local_88 = local_88 & 0xffffffff;
          }
          else if ((cVar11 == -2 && (uVar12 & 0xfffffffe) == 4) ||
                  (((cVar11 == -5 && ((int)local_58 <= (int)uVar12)) &&
                   ((int)uVar12 < (int)local_58 + 2)))) {
            local_89 = MAGENTA;
            if (local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
               super__Vector_impl_data._M_finish = MAGENTA;
              goto LAB_00151de3;
            }
            std::vector<colour,_std::allocator<colour>_>::_M_realloc_insert<colour>
                      (&local_78,
                       (iterator)
                       local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_89);
            local_88 = local_88 & 0xffffffff;
          }
          else {
            local_89 = cyan;
            if (local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<colour,_std::allocator<colour>_>::_M_realloc_insert<colour>
                        (&local_78,
                         (iterator)
                         local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_89);
              local_88 = local_88 & 0xffffffff;
            }
            else {
              *local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
               super__Vector_impl_data._M_finish = cyan;
LAB_00151de3:
              local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
              local_88 = local_88 & 0xffffffff;
            }
          }
          local_80 = 0;
          goto LAB_00151a72;
        }
        local_89 = (iVar14 != 0x21) * -0x80 + RED;
        uVar7 = CONCAT71((int7)((ulong)uVar7 >> 8),local_89);
        if (local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
           super__Vector_impl_data._M_finish = local_89;
          goto LAB_00151c65;
        }
        std::vector<colour,_std::allocator<colour>_>::_M_realloc_insert<colour>
                  (&local_78,
                   (iterator)
                   local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_89);
        uVar7 = extraout_RAX_00;
      }
      local_88 = 0;
      local_50 = CONCAT71((int7)((ulong)uVar7 >> 8),(undefined1)local_7c);
      local_80 = 0;
      goto LAB_00151a72;
    }
    local_89 = (iVar14 != 0x11) * -0x80 + YELLOW;
    if (local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<colour,_std::allocator<colour>_>::_M_realloc_insert<colour>
                (&local_78,
                 (iterator)
                 local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_89);
    }
    else {
      *local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_89;
      local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_78.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    local_80 = local_80 + 1;
    local_88 = (ulong)uVar10;
  } while( true );
}

Assistant:

void ViewTrack_MFM_FM(Encoding encoding, BitBuffer& bitbuf)
{
    auto max_size = bitbuf.track_bitsize() * 110 / 100;

    Data track_data;
    std::vector<colour> colours;
    track_data.reserve(max_size);
    colours.reserve(max_size);

    uint32_t dword = 0;
    int bits = 0, a1 = 0, am_dist = 0xffff, data_size = 0;
    uint8_t am = 0;
    uint16_t sync_mask = opt.a1sync ? 0xffdf : 0xffff;

    bitbuf.seek(0);
    while (!bitbuf.wrapped())
    {
        dword = (dword << 1) | bitbuf.read1();
        ++bits;

        bool found_am = false;
        if (encoding == Encoding::MFM && (dword & sync_mask) == 0x4489)
        {
            found_am = true;
        }
        else if (encoding == Encoding::FM)
        {
            switch (dword)
            {
            case 0xaa222888:    // F8/C7 DDAM
            case 0xaa22288a:    // F9/C7 Alt-DDAM
            case 0xaa2228a8:    // FA/C7 Alt-DAM
            case 0xaa2228aa:    // FB/C7 DAM
            case 0xaa2a2a88:    // FC/D7 IAM
            case 0xaa222a8a:    // FD/C7 RX02 DAM
            case 0xaa222aa8:    // FE/C7 IDAM
                found_am = true;
                break;
            }
        }

        if (found_am || (bits == (encoding == Encoding::MFM ? 16 : 32)))
        {
            // Decode data byte.
            uint8_t b = 0;
            if (encoding == Encoding::MFM)
            {
                for (int i = 7; i >= 0; --i)
                    b |= static_cast<uint8_t>(((dword >> (i * 2)) & 1) << i);
            }
            else
            {
                for (int i = 7; i >= 0; --i)
                    b |= static_cast<uint8_t>(((dword >> (i * 4 + 1)) & 1) << i);
            }
            track_data.push_back(b);
            ++am_dist;

            if (encoding == Encoding::MFM && found_am)
            {
                // A1 sync byte (red if aligned to bitstream, magenta if not).
                colours.push_back((bits == 16) ? colour::YELLOW : colour::yellow);
                ++a1;
            }
            else
            {
                if (am == 0xfe && am_dist == 4)
                    data_size = Sector::SizeCodeToLength(b);

                if (a1 == 3)
                {
                    colours.push_back(colour::RED);
                    am = b;
                    am_dist = 0;
                }
                else if (encoding == Encoding::FM && found_am)
                {
                    colours.push_back((bits == 32) ? colour::RED : colour::red);
                    am = b;
                    am_dist = 0;
                }
                else if (am == 0xfe && am_dist >= 1 && am_dist <= 4)
                {
                    colours.push_back((am_dist == 3) ? colour::GREEN : colour::green);
                }
                else if (am == 0xfb && am_dist >= 1 && am_dist <= data_size)
                {
                    colours.push_back(colour::white);
                }
                else if ((am == 0xfe && am_dist > 4 && am_dist <= 6) ||
                    (am == 0xfb && am_dist > data_size&& am_dist <= (data_size + 2)))
                {
                    colours.push_back(colour::MAGENTA);
                }
                else
                {
                    colours.push_back(colour::grey);
                }

                a1 = 0;
            }

            bits = 0;
        }
    }

    auto show_begin = std::max(opt.bytes_begin, 0);
    auto show_end = (opt.bytes_end < 0) ? track_data.size() :
        std::min(opt.bytes_end, track_data.size());
    if (show_end > show_begin)
    {
        util::cout << encoding << " Decode (" << bitbuf.track_bitsize() << " bits):\n";
        util::hex_dump(track_data.begin(), track_data.begin() + show_end,
            show_begin, colours.data());
    }
}